

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_115e484::ParsedArguments::apply(ParsedArguments *this,Struct *reflectable)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar4;
  ulong uVar5;
  undefined1 local_58 [8];
  string property;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *argument;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  Struct *reflectable_local;
  ParsedArguments *this_local;
  
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->selections);
  argument = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->selections);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&argument);
    if (!bVar1) break;
    property.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_58);
    uVar2 = std::__cxx11::string::begin();
    uVar3 = std::__cxx11::string::end();
    bVar4 = std::back_inserter<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
    std::
    transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,(anonymous_namespace)::ParsedArguments::apply(Reflection::Struct*)const::_lambda(char)_1_>
              (uVar2,uVar3,bVar4.container);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Reflection::fuzzy_set
                (reflectable,(string *)local_58,(string *)(property.field_2._8_8_ + 0x20));
    }
    else {
      Reflection::set<bool>(reflectable,(string *)local_58,true,0);
    }
    std::__cxx11::string::~string((string *)local_58);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void apply(Reflection::Struct *reflectable) const {
		for(const auto &argument: selections) {
			// Replace any dashes with underscores in the argument name.
			std::string property;
			std::transform(argument.first.begin(), argument.first.end(), std::back_inserter(property), [](char c) { return c == '-' ? '_' : c; });

			if(argument.second.empty()) {
				Reflection::set<bool>(*reflectable, property, true);
			} else {
				Reflection::fuzzy_set(*reflectable, property, argument.second);
			}
		}
	}